

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall
Json::OurReader::pushError(OurReader *this,Value *value,String *message,Value *extra)

{
  long lVar1;
  ptrdiff_t pVar2;
  Value *in_RCX;
  string *in_RDX;
  Value *in_RSI;
  long in_RDI;
  ErrorInfo info;
  Token token;
  ptrdiff_t length;
  value_type *in_stack_ffffffffffffff38;
  deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_> *this_00;
  string local_70 [32];
  long local_50;
  undefined4 local_48;
  long lStack_40;
  long local_38;
  long local_30;
  Value *local_28;
  string *local_20;
  Value *local_18;
  byte local_1;
  
  local_30 = *(long *)(in_RDI + 200) - *(long *)(in_RDI + 0xc0);
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pVar2 = Value::getOffsetStart(in_RSI);
  if (pVar2 <= local_30) {
    pVar2 = Value::getOffsetLimit(local_18);
    if (pVar2 <= local_30) {
      pVar2 = Value::getOffsetLimit(local_28);
      if (pVar2 <= local_30) {
        local_48 = 0x10;
        lVar1 = *(long *)(in_RDI + 0xc0);
        pVar2 = Value::getOffsetStart(local_18);
        lStack_40 = lVar1 + pVar2;
        lVar1 = *(long *)(in_RDI + 0xc0);
        pVar2 = Value::getOffsetLimit(local_18);
        local_38 = lVar1 + pVar2;
        ErrorInfo::ErrorInfo((ErrorInfo *)0x1efac6);
        std::__cxx11::string::operator=(local_70,local_20);
        this_00 = *(deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                    **)(in_RDI + 0xc0);
        pVar2 = Value::getOffsetStart(local_28);
        local_50 = (long)&(this_00->
                          super__Deque_base<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>
                          )._M_impl.super__Deque_impl_data._M_map + pVar2;
        std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::
        push_back(this_00,in_stack_ffffffffffffff38);
        local_1 = 1;
        ErrorInfo::~ErrorInfo((ErrorInfo *)0x1efb52);
        goto LAB_001efb6e;
      }
    }
  }
  local_1 = 0;
LAB_001efb6e:
  return (bool)(local_1 & 1);
}

Assistant:

bool OurReader::pushError(const Value& value,
                          const String& message,
                          const Value& extra) {
  ptrdiff_t length = end_ - begin_;
  if (value.getOffsetStart() > length || value.getOffsetLimit() > length ||
      extra.getOffsetLimit() > length)
    return false;
  Token token;
  token.type_ = tokenError;
  token.start_ = begin_ + value.getOffsetStart();
  token.end_ = begin_ + value.getOffsetLimit();
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = begin_ + extra.getOffsetStart();
  errors_.push_back(info);
  return true;
}